

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

void boost::deflate::inflate_stream_test::testInflateErrors(IDecompressor *d)

{
  error_code expected;
  error_code expected_00;
  error_code expected_01;
  error_code expected_02;
  error_code expected_03;
  error_code expected_04;
  error_code expected_05;
  error_code expected_06;
  error_code expected_07;
  error_code expected_08;
  error_code expected_09;
  error_code expected_10;
  error_code expected_11;
  error_code expected_12;
  error_code expected_13;
  error_code expected_14;
  error_code expected_15;
  IDecompressor IVar1;
  IDecompressor IVar2;
  IDecompressor local_370;
  undefined2 local_368;
  undefined1 uStack_366;
  undefined1 uStack_365;
  undefined1 uStack_364;
  undefined1 uStack_363;
  undefined1 uStack_362;
  undefined1 uStack_361;
  initializer_list<unsigned_char> *local_360;
  error_category *local_358;
  initializer_list<unsigned_char> *local_350;
  error_category *local_348;
  initializer_list<unsigned_char> *local_340;
  error_category *local_338;
  initializer_list<unsigned_char> *local_330;
  error_category *local_328;
  initializer_list<unsigned_char> *local_320;
  error_category *local_318;
  initializer_list<unsigned_char> *local_310;
  error_category *local_308;
  initializer_list<unsigned_char> *local_300;
  error_category *local_2f8;
  initializer_list<unsigned_char> *local_2f0;
  error_category *local_2e8;
  initializer_list<unsigned_char> *local_2e0;
  error_category *local_2d8;
  initializer_list<unsigned_char> *local_2d0;
  error_category *local_2c8;
  initializer_list<unsigned_char> *local_2c0;
  error_category *local_2b8;
  initializer_list<unsigned_char> *local_2b0;
  error_category *local_2a8;
  initializer_list<unsigned_char> *local_2a0;
  error_category *local_298;
  initializer_list<unsigned_char> *local_290;
  error_category *local_288;
  initializer_list<unsigned_char> *local_280;
  error_category *local_278;
  initializer_list<unsigned_char> *local_270;
  error_category *local_268;
  initializer_list<unsigned_char> *local_260;
  error_category *local_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  IVar1._vptr_IDecompressor = (_func_int **)&local_370;
  local_370._vptr_IDecompressor._4_1_ = 0;
  local_370._vptr_IDecompressor._0_1_ = 0;
  local_370._vptr_IDecompressor._1_1_ = 0;
  local_370._vptr_IDecompressor._2_1_ = 0;
  local_370._vptr_IDecompressor._3_1_ = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_260,invalid_stored_length,(type *)0x0);
  expected.cat_ = (error_category *)0x0;
  expected._0_8_ = local_258;
  check_abi_cxx11_(&local_50,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_260,expected,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_50);
  local_370._vptr_IDecompressor._0_1_ = 3;
  local_370._vptr_IDecompressor._1_1_ = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_270,end_of_stream,(type *)0x0);
  expected_00.cat_ = (error_category *)0x0;
  expected_00._0_8_ = local_268;
  check_abi_cxx11_(&local_70,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_270,expected_00,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_70);
  local_370._vptr_IDecompressor._0_1_ = 6;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_280,invalid_block_type,(type *)0x0);
  expected_01.cat_ = (error_category *)0x0;
  expected_01._0_8_ = local_278;
  check_abi_cxx11_(&local_90,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_280,expected_01,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_90);
  local_370._vptr_IDecompressor._0_1_ = 0xfc;
  local_370._vptr_IDecompressor._1_1_ = 0;
  local_370._vptr_IDecompressor._2_1_ = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_290,too_many_symbols,(type *)0x0);
  expected_02.cat_ = (error_category *)0x0;
  expected_02._0_8_ = local_288;
  check_abi_cxx11_(&local_b0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_290,expected_02,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_b0);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0;
  local_370._vptr_IDecompressor._2_1_ = 0xfe;
  local_370._vptr_IDecompressor._3_1_ = 0xff;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2a0,incomplete_length_set,(type *)0x0);
  expected_03.cat_ = (error_category *)0x0;
  expected_03._0_8_ = local_298;
  check_abi_cxx11_(&local_d0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_2a0,expected_03,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_d0);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0;
  local_370._vptr_IDecompressor._2_1_ = 0x24;
  local_370._vptr_IDecompressor._3_1_ = 0x49;
  local_370._vptr_IDecompressor._4_1_ = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2b0,invalid_bit_length_repeat,(type *)0x0);
  expected_04.cat_ = (error_category *)0x0;
  expected_04._0_8_ = local_2a8;
  check_abi_cxx11_(&local_f0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_2b0,expected_04,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_f0);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0;
  local_370._vptr_IDecompressor._2_1_ = 0x24;
  local_370._vptr_IDecompressor._3_1_ = 0xe9;
  local_370._vptr_IDecompressor._4_1_ = 0xff;
  local_370._vptr_IDecompressor._5_1_ = 0xff;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2c0,invalid_bit_length_repeat,(type *)0x0);
  expected_05.cat_ = (error_category *)0x0;
  expected_05._0_8_ = local_2b8;
  check_abi_cxx11_(&local_110,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_2c0,expected_05,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_110);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0;
  local_370._vptr_IDecompressor._2_1_ = 0x24;
  local_370._vptr_IDecompressor._3_1_ = 0xe9;
  local_370._vptr_IDecompressor._4_1_ = 0xff;
  local_370._vptr_IDecompressor._5_1_ = 0x6d;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2d0,missing_eob,(type *)0x0);
  expected_06.cat_ = (error_category *)0x0;
  expected_06._0_8_ = local_2c8;
  check_abi_cxx11_(&local_130,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_2d0,expected_06,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_130);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0x80;
  local_370._vptr_IDecompressor._2_1_ = 0x49;
  local_370._vptr_IDecompressor._3_1_ = 0x92;
  local_370._vptr_IDecompressor._4_1_ = 0x24;
  local_370._vptr_IDecompressor._5_1_ = 0x49;
  local_370._vptr_IDecompressor._6_1_ = 0x92;
  local_370._vptr_IDecompressor._7_1_ = 0x24;
  local_368 = 0xff71;
  uStack_366 = 0xff;
  uStack_365 = 0x93;
  uStack_364 = 0x11;
  uStack_363 = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2e0,over_subscribed_length,(type *)0x0);
  expected_07.cat_ = (error_category *)0x0;
  expected_07._0_8_ = local_2d8;
  check_abi_cxx11_(&local_150,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_2e0,expected_07,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_150);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0x80;
  local_370._vptr_IDecompressor._2_1_ = 0x49;
  local_370._vptr_IDecompressor._3_1_ = 0x92;
  local_370._vptr_IDecompressor._4_1_ = 0x24;
  local_370._vptr_IDecompressor._5_1_ = 0xf;
  local_370._vptr_IDecompressor._6_1_ = 0xb4;
  local_370._vptr_IDecompressor._7_1_ = 0xff;
  local_368 = 0xc3ff;
  uStack_366 = 0x84;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_2f0,incomplete_length_set,(type *)0x0);
  expected_08.cat_ = (error_category *)0x0;
  expected_08._0_8_ = local_2e8;
  check_abi_cxx11_(&local_170,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_2f0,expected_08,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_170);
  local_370._vptr_IDecompressor._0_1_ = 4;
  local_370._vptr_IDecompressor._1_1_ = 0xc0;
  local_370._vptr_IDecompressor._2_1_ = 0x81;
  local_370._vptr_IDecompressor._3_1_ = 8;
  local_370._vptr_IDecompressor._4_1_ = 0;
  local_370._vptr_IDecompressor._5_1_ = 0;
  local_370._vptr_IDecompressor._6_1_ = 0;
  local_370._vptr_IDecompressor._7_1_ = 0;
  local_368 = 0x7f20;
  uStack_366 = 0xeb;
  uStack_365 = 0xb;
  uStack_364 = 0;
  uStack_363 = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_300,invalid_literal_length,(type *)0x0);
  expected_09.cat_ = (error_category *)0x0;
  expected_09._0_8_ = local_2f8;
  check_abi_cxx11_(&local_190,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_300,expected_09,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_190);
  local_370._vptr_IDecompressor._0_1_ = 2;
  local_370._vptr_IDecompressor._1_1_ = 0x7e;
  local_370._vptr_IDecompressor._2_1_ = 0xff;
  local_370._vptr_IDecompressor._3_1_ = 0xff;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_310,invalid_distance_code,(type *)0x0);
  expected_10.cat_ = (error_category *)0x0;
  expected_10._0_8_ = local_308;
  check_abi_cxx11_(&local_1b0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_310,expected_10,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_1b0);
  local_370._vptr_IDecompressor._0_1_ = 0xc;
  local_370._vptr_IDecompressor._1_1_ = 0xc0;
  local_370._vptr_IDecompressor._2_1_ = 0x81;
  local_370._vptr_IDecompressor._7_1_ = 0;
  local_370._vptr_IDecompressor._3_1_ = 0;
  local_370._vptr_IDecompressor._4_1_ = 0;
  local_370._vptr_IDecompressor._5_1_ = 0;
  local_370._vptr_IDecompressor._6_1_ = 0;
  local_368 = 0xff90;
  uStack_366 = 0x6b;
  uStack_365 = 4;
  uStack_364 = 0;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_320,invalid_distance,(type *)0x0);
  expected_11.cat_ = (error_category *)0x0;
  expected_11._0_8_ = local_318;
  check_abi_cxx11_(&local_1d0,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_320,expected_11,0xf,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_1d0);
  IVar2._vptr_IDecompressor = (_func_int **)0x2cb2cb249181e005;
  local_370._vptr_IDecompressor._0_1_ = SUB81(&stack0xfffffffffffffc78,0);
  local_370._vptr_IDecompressor._1_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 8);
  local_370._vptr_IDecompressor._2_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 0x10);
  local_370._vptr_IDecompressor._3_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 0x18);
  local_370._vptr_IDecompressor._4_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 0x20);
  local_370._vptr_IDecompressor._5_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 0x28);
  local_370._vptr_IDecompressor._6_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 0x30);
  local_370._vptr_IDecompressor._7_1_ = (undefined1)((ulong)&stack0xfffffffffffffc78 >> 0x38);
  local_368 = 0x17;
  uStack_366 = 0;
  uStack_365 = 0;
  uStack_364 = 0;
  uStack_363 = 0;
  uStack_362 = 0;
  uStack_361 = 0;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_330,end_of_stream,(type *)0x0);
  IVar1._vptr_IDecompressor = (_func_int **)&local_370;
  expected_12.cat_ = (error_category *)0x0;
  expected_12._0_8_ = local_328;
  check_abi_cxx11_(&local_1f0,(inflate_stream_test *)d,(IDecompressor *)IVar1._vptr_IDecompressor,
                   local_330,expected_12,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_1f0);
  local_370._vptr_IDecompressor._0_1_ = 0xed;
  local_370._vptr_IDecompressor._1_1_ = 0xc0;
  local_370._vptr_IDecompressor._2_1_ = 1;
  local_370._vptr_IDecompressor._3_1_ = 1;
  local_370._vptr_IDecompressor._4_1_ = 0;
  local_370._vptr_IDecompressor._5_1_ = 0;
  local_370._vptr_IDecompressor._6_1_ = 0;
  local_370._vptr_IDecompressor._7_1_ = 0x40;
  local_368 = 0xff20;
  uStack_366 = 0x57;
  uStack_365 = 0x1b;
  uStack_364 = 0x42;
  uStack_363 = 0x2c;
  uStack_362 = 0x4f;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_340,end_of_stream,(type *)0x0);
  expected_13.cat_ = (error_category *)0x0;
  expected_13._0_8_ = local_338;
  check_abi_cxx11_(&local_210,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_340,expected_13,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_210);
  local_370._vptr_IDecompressor._0_1_ = 2;
  local_370._vptr_IDecompressor._1_1_ = 8;
  local_370._vptr_IDecompressor._2_1_ = 0x20;
  local_370._vptr_IDecompressor._3_1_ = 0x80;
  local_370._vptr_IDecompressor._4_1_ = 0;
  local_370._vptr_IDecompressor._5_1_ = 3;
  local_370._vptr_IDecompressor._6_1_ = 0;
  IVar2._vptr_IDecompressor = IVar1._vptr_IDecompressor;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_350,end_of_stream,(type *)0x0);
  expected_14.cat_ = (error_category *)0x0;
  expected_14._0_8_ = local_348;
  check_abi_cxx11_(&local_230,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_350,expected_14,0xf,0xffffffffffffffff,(size_t)IVar2._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_230);
  local_370._vptr_IDecompressor._0_1_ = 0x78;
  local_370._vptr_IDecompressor._1_1_ = 0x9c;
  local_370._vptr_IDecompressor._2_1_ = 3;
  local_370._vptr_IDecompressor._3_1_ = 0;
  local_370._vptr_IDecompressor._4_1_ = 0;
  local_370._vptr_IDecompressor._5_1_ = 0;
  local_370._vptr_IDecompressor._6_1_ = 0;
  local_370._vptr_IDecompressor._7_1_ = 1;
  local_368 = 0x9c78;
  uStack_366 = 0xff;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_360,invalid_stored_length,(type *)0x0);
  expected_15.cat_ = (error_category *)0x0;
  expected_15._0_8_ = local_358;
  check_abi_cxx11_(&local_250,(inflate_stream_test *)d,(IDecompressor *)&stack0xfffffffffffffc78,
                   local_360,expected_15,0xf,0xffffffffffffffff,(size_t)IVar1._vptr_IDecompressor);
  std::__cxx11::string::~string((string *)&local_250);
  return;
}

Assistant:

static
    void testInflateErrors(IDecompressor& d)
    {
        check(d, {0x00, 0x00, 0x00, 0x00, 0x00},
            error::invalid_stored_length);
        check(d, {0x03, 0x00},
            error::end_of_stream);
        check(d, {0x06},
            error::invalid_block_type);
        check(d, {0xfc, 0x00, 0x00},
            error::too_many_symbols);
        check(d, {0x04, 0x00, 0xfe, 0xff},
            error::incomplete_length_set);
        check(d, {0x04, 0x00, 0x24, 0x49, 0x00},
            error::invalid_bit_length_repeat);
        check(d, {0x04, 0x00, 0x24, 0xe9, 0xff, 0xff},
            error::invalid_bit_length_repeat);
        check(d, {0x04, 0x00, 0x24, 0xe9, 0xff, 0x6d},
            error::missing_eob);
        check(d, {0x04, 0x80, 0x49, 0x92, 0x24, 0x49, 0x92, 0x24,
               0x71, 0xff, 0xff, 0x93, 0x11, 0x00},
            error::over_subscribed_length);
        check(d, {0x04, 0x80, 0x49, 0x92, 0x24, 0x0f, 0xb4, 0xff,
               0xff, 0xc3, 0x84},
            error::incomplete_length_set);
        check(d, {0x04, 0xc0, 0x81, 0x08, 0x00, 0x00, 0x00, 0x00,
               0x20, 0x7f, 0xeb, 0x0b, 0x00, 0x00},
            error::invalid_literal_length);
        check(d, {0x02, 0x7e, 0xff, 0xff},
            error::invalid_distance_code);
        check(d, {0x0c, 0xc0, 0x81, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x90, 0xff, 0x6b, 0x04, 0x00},
            error::invalid_distance);
        check(d, {0x05,0xe0, 0x81, 0x91, 0x24, 0xcb, 0xb2, 0x2c,
               0x49, 0xe2, 0x0f, 0x2e, 0x8b, 0x9a, 0x47, 0x56,
               0x9f, 0xfb, 0xfe, 0xec, 0xd2, 0xff, 0x1f},
            error::end_of_stream);
        check(d, {0xed, 0xc0, 0x01, 0x01, 0x00, 0x00, 0x00, 0x40,
               0x20, 0xff, 0x57, 0x1b, 0x42, 0x2c, 0x4f},
            error::end_of_stream);
        check(d, {0x02, 0x08, 0x20, 0x80, 0x00, 0x03, 0x00},
            error::end_of_stream);
        check(d, {0x78, 0x9c, 0x03, 0x00, 0x00, 0x00, 0x00, 0x01, 0x78, 0x9c, 0xff},
            error::invalid_stored_length);
    }